

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isNearestSampleResultValid<tcu::LookupPrecision,float>
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               int coordZ,Vector<float,_4> *result)

{
  ulong uVar1;
  long lVar2;
  int c;
  bool bVar3;
  int y;
  int z;
  ulong uVar4;
  int j;
  int c_00;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Vector<float,_4> color;
  Vector<bool,_4> res;
  Vec2 vBounds;
  Vec2 uBounds;
  TextureFormat local_78;
  float fStack_70;
  float fStack_6c;
  LookupPrecision *local_60;
  Vector<float,_4> *local_58;
  undefined4 local_50;
  ChannelType CStack_4c;
  int aiStack_48 [2];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_58 = result;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  local_60 = prec;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar5 = floorf(local_38);
  fVar6 = floorf(local_34);
  fVar7 = floorf(local_40);
  c_00 = (int)fVar7;
  fVar7 = floorf(local_3c);
  if (c_00 <= (int)fVar7) {
    c = (int)fVar5;
    do {
      for (; c <= (int)fVar6; c = c + 1) {
        y = TexVerifierUtil::wrap(sampler->wrapS,c,(level->m_size).m_data[0]);
        z = TexVerifierUtil::wrap(sampler->wrapT,c_00,(level->m_size).m_data[1]);
        if ((((y < 0) || ((level->m_size).m_data[0] <= y)) || (z < 0)) ||
           ((((level->m_size).m_data[1] <= z || (coordZ < 0)) ||
            ((level->m_size).m_data[2] <= coordZ)))) {
          sampleTextureBorder<float>(&local_78,(Sampler *)level);
        }
        else {
          ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_50,(int)level,y,z);
          bVar3 = isSRGB(level->m_format);
          if (bVar3) {
            sRGBToLinear((tcu *)&local_78,(Vec4 *)&local_50);
          }
          else {
            local_78.type = CStack_4c;
            local_78.order = local_50;
            fStack_70 = (float)aiStack_48[0];
            fStack_6c = (float)aiStack_48[1];
          }
        }
        auVar9._0_4_ = (float)local_78.order - local_58->m_data[0];
        auVar9._4_4_ = (float)local_78.type - local_58->m_data[1];
        auVar9._8_4_ = fStack_70 - local_58->m_data[2];
        auVar9._12_4_ = fStack_6c - local_58->m_data[3];
        uVar4 = CONCAT44(auVar9._4_4_,auVar9._0_4_);
        auVar8._0_8_ = uVar4 ^ 0x8000000080000000;
        auVar8._8_4_ = -auVar9._8_4_;
        auVar8._12_4_ = -auVar9._12_4_;
        auVar9 = maxps(auVar8,auVar9);
        auVar10._4_4_ = -(uint)(auVar9._4_4_ <= (local_60->colorThreshold).m_data[1]);
        auVar10._0_4_ = -(uint)(auVar9._0_4_ <= (local_60->colorThreshold).m_data[0]);
        auVar10._8_4_ = -(uint)(auVar9._8_4_ <= (local_60->colorThreshold).m_data[2]);
        auVar10._12_4_ = -(uint)(auVar9._12_4_ <= (local_60->colorThreshold).m_data[3]);
        auVar9 = packssdw(auVar10,auVar10);
        auVar9 = packsswb(auVar9,auVar9);
        local_50 = *(ChannelOrder *)(local_60->colorMask).m_data ^ (ChannelOrder)DAT_01b89df0 |
                   auVar9._0_4_ & (ChannelOrder)DAT_01b89df0;
        if ((char)local_50 != '\0') {
          uVar4 = 0xffffffffffffffff;
          do {
            if (uVar4 == 2) {
              return true;
            }
            uVar1 = uVar4 + 1;
            lVar2 = uVar4 + 2;
            uVar4 = uVar1;
          } while (*(char *)((long)&local_50 + lVar2) != '\0');
          if (2 < uVar1) {
            return true;
          }
        }
      }
      c_00 = c_00 + 1;
      c = (int)fVar5;
    } while (c_00 <= (int)fVar7);
  }
  return false;
}

Assistant:

static bool isNearestSampleResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const PrecType&						prec,
										const Vec2&							coord,
										const int							coordZ,
										const Vector<ScalarType, 4>&		result)
{
	const Vec2		uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		vBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int		minI			= deFloorFloatToInt32(uBounds.x());
	const int		maxI			= deFloorFloatToInt32(uBounds.y());
	const int		minJ			= deFloorFloatToInt32(vBounds.x());
	const int		maxJ			= deFloorFloatToInt32(vBounds.y());

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			const int					x		= wrap(sampler.wrapS, i, level.getWidth());
			const int					y		= wrap(sampler.wrapT, j, level.getHeight());
			const Vector<ScalarType, 4>	color	= lookup<ScalarType>(level, sampler, x, y, coordZ);

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}